

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O2

void __thiscall
amrex::FABio_ascii::write_header(FABio_ascii *this,ostream *os,FArrayBox *f,int nvar)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"FAB: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = std::operator<<(poVar1,"IEEE");
  std::operator<<(poVar1,'\n');
  FABio::write_header((FABio *)poVar1,os,f,nvar);
  return;
}

Assistant:

void
FABio_ascii::write_header (std::ostream&    os,
                           const FArrayBox& f,
                           int              nvar) const
{
    os << "FAB: "
       << FABio::FAB_ASCII
       << ' '
       << 0
       << ' '
       << sys_name
       << '\n';
    FABio::write_header(os, f, nvar);
}